

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::RunningTest::addSection(RunningTest *this,string *name)

{
  bool bVar1;
  SectionInfo *pSVar2;
  
  if (this->m_runStatus == NothingRun) {
    this->m_runStatus = EncounteredASection;
  }
  pSVar2 = SectionInfo::findSubSection(this->m_currentSection,name);
  if (pSVar2 == (SectionInfo *)0x0) {
    pSVar2 = SectionInfo::addSubSection(this->m_currentSection,name);
    this->m_changed = true;
  }
  if (((this->m_runStatus & ~EncounteredASection) == RanAtLeastOneSection) ||
     (2 < (int)pSVar2->m_status)) {
    bVar1 = false;
  }
  else {
    this->m_currentSection = pSVar2;
    this->m_lastSectionToRun = (SectionInfo *)0x0;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool addSection( const std::string& name ) {
            if( m_runStatus == NothingRun )
                m_runStatus = EncounteredASection;

            SectionInfo* thisSection = m_currentSection->findSubSection( name );
            if( !thisSection ) {
                thisSection = m_currentSection->addSubSection( name );
                m_changed = true;
            }

            if( !wasSectionSeen() && thisSection->shouldRun() ) {
                m_currentSection = thisSection;
                m_lastSectionToRun = NULL;
                return true;
            }
            return false;
        }